

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.c
# Opt level: O0

_Bool isVariable(char *str)

{
  int iVar1;
  variable *local_20;
  variable *var;
  char *str_local;
  
  local_20 = variables_first;
  if (str != (char *)0x0) {
    for (; local_20 != (variable *)0x0; local_20 = local_20->next) {
      iVar1 = strcmp(str,local_20->key);
      if (iVar1 == 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool isVariable(const char *str)
{
    struct variable *var = variables_first;

    if (str == NULL) {
        return false;
    }

    while (var != NULL) {
        if (!strcmp(str, var->key)) {
            return true;
        }

        var = var->next;
    }

    return false;
}